

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_freeDDict(ZSTD_DDict *ddict)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  long in_RDI;
  ZSTD_customMem cMem;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uVar1;
  void *ptr;
  
  if (in_RDI != 0) {
    uVar1 = *(undefined8 *)(in_RDI + 0x6ac0);
    ptr = *(void **)(in_RDI + 0x6ac8);
    customMem.customFree = (ZSTD_freeFunction)uVar1;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
    customMem.opaque = ptr;
    ZSTD_customFree(ptr,customMem);
    customMem_00.customFree = (ZSTD_freeFunction)uVar1;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
    customMem_00.opaque = ptr;
    ZSTD_customFree(ptr,customMem_00);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeDDict(ZSTD_DDict* ddict)
{
    if (ddict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = ddict->cMem;
        ZSTD_customFree(ddict->dictBuffer, cMem);
        ZSTD_customFree(ddict, cMem);
        return 0;
    }
}